

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

char * loguru::get_verbosity_name(Verbosity verbosity)

{
  char *pcVar1;
  
  if ((s_verbosity_to_name_callback != (code *)0x0) &&
     (pcVar1 = (char *)(*s_verbosity_to_name_callback)(verbosity), pcVar1 != (char *)0x0)) {
    return pcVar1;
  }
  if (verbosity < -2) {
    pcVar1 = "FATL";
  }
  else if (verbosity + 2U < 3) {
    pcVar1 = &DAT_0013fcc8 + *(int *)(&DAT_0013fcc8 + (ulong)(verbosity + 2U) * 4);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* get_verbosity_name(Verbosity verbosity)
	{
		auto name = s_verbosity_to_name_callback
				? (*s_verbosity_to_name_callback)(verbosity)
				: nullptr;

		// Use standard replacements if callback fails:
		if (!name)
		{
			if (verbosity <= Verbosity_FATAL) {
				name = "FATL";
			} else if (verbosity == Verbosity_ERROR) {
				name = "ERR";
			} else if (verbosity == Verbosity_WARNING) {
				name = "WARN";
			} else if (verbosity == Verbosity_INFO) {
				name = "INFO";
			}
		}

		return name;
	}